

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.cpp
# Opt level: O1

page * __thiscall page::operator=(page *this,page *p)

{
  byte bVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  if (this != p) {
    if (this->slots != (uint8_t *)0x0) {
      operator_delete__(this->slots);
    }
    this->pageID = p->pageID;
    this->numRecords = p->numRecords;
    bVar1 = p->slotSize;
    this->slotSize = bVar1;
    this->recordSize = p->recordSize;
    puVar2 = (uint8_t *)operator_new__((ulong)bVar1);
    this->slots = puVar2;
    if (this->slotSize != '\0') {
      uVar3 = 0;
      do {
        this->slots[uVar3] = p->slots[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->slotSize);
    }
  }
  return this;
}

Assistant:

page &page::operator=(const page &p) {
    if(this != &p) {
        this->~page();

        pageID = p.pageID;
        numRecords = p.numRecords;
        slotSize = p.slotSize;
        recordSize = p.recordSize;

        slots = new uint8_t[slotSize];

        for (int i = 0; i < slotSize; ++i) {
            slots[i] = p.slots[i];
        }
    }

    return *this;
}